

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O2

void __thiscall ALCdevice::ProcessHrtf(ALCdevice *this,size_t SamplesToDo)

{
  pointer paVar1;
  
  paVar1 = (this->RealOut).Buffer.mData;
  (*(code *)(anonymous_namespace)::MixDirectHrtf)
            (paVar1 + (this->RealOut).ChannelIndex._M_elems[0],
             paVar1 + (this->RealOut).ChannelIndex._M_elems[1],(this->Dry).Buffer.mData,
             (this->Dry).Buffer.mDataEnd,this->HrtfAccumData,
             (this->mHrtfState)._M_t.
             super___uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_>._M_t.
             super__Tuple_impl<0UL,_DirectHrtfState_*,_std::default_delete<DirectHrtfState>_>.
             super__Head_base<0UL,_DirectHrtfState_*,_false>._M_head_impl,SamplesToDo);
  return;
}

Assistant:

void ALCdevice::ProcessHrtf(const size_t SamplesToDo)
{
    /* HRTF is stereo output only. */
    const ALuint lidx{RealOut.ChannelIndex[FrontLeft]};
    const ALuint ridx{RealOut.ChannelIndex[FrontRight]};

    MixDirectHrtf(RealOut.Buffer[lidx], RealOut.Buffer[ridx], Dry.Buffer, HrtfAccumData,
        mHrtfState.get(), SamplesToDo);
}